

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.cpp
# Opt level: O2

void __thiscall
LocalBGValueFunctionVector::~LocalBGValueFunctionVector(LocalBGValueFunctionVector *this)

{
  ~LocalBGValueFunctionVector(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

LocalBGValueFunctionVector::~LocalBGValueFunctionVector()
{
}